

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O0

int FindLatestHokuyoMessage(char *buf,int buflen,char **pFoundMsg,int *pFoundMsgTmpLen)

{
  int iVar1;
  int local_3c;
  int msglen;
  int len;
  char *ptr;
  int *pFoundMsgTmpLen_local;
  char **pFoundMsg_local;
  char *pcStack_18;
  int buflen_local;
  char *buf_local;
  
  _msglen = (char *)0x0;
  local_3c = 0;
  ptr = (char *)pFoundMsgTmpLen;
  pFoundMsgTmpLen_local = (int *)pFoundMsg;
  pFoundMsg_local._4_4_ = buflen;
  pcStack_18 = buf;
  iVar1 = FindHokuyoMessage(buf,buflen,(char **)&msglen,&local_3c);
  if (iVar1 == 0) {
    do {
      *(char **)pFoundMsgTmpLen_local = _msglen;
      *(int *)ptr = local_3c;
      iVar1 = FindHokuyoMessage((char *)(*(long *)pFoundMsgTmpLen_local + 0x1d),*(int *)ptr + -0x1d,
                                (char **)&msglen,&local_3c);
    } while (iVar1 == 0);
    buf_local._4_4_ = 0;
  }
  else {
    pFoundMsgTmpLen_local[0] = 0;
    pFoundMsgTmpLen_local[1] = 0;
    ptr[0] = '\0';
    ptr[1] = '\0';
    ptr[2] = '\0';
    ptr[3] = '\0';
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

inline int FindLatestHokuyoMessage(char* buf, int buflen, char** pFoundMsg, int* pFoundMsgTmpLen)
{
	char* ptr = NULL;
	int len = 0;
	int msglen = 0;

	if (FindHokuyoMessage(buf, buflen, &ptr, &len) != EXIT_SUCCESS)
	{
		*pFoundMsg = NULL;
		*pFoundMsgTmpLen = 0;
		return EXIT_FAILURE;
	}
	for (;;) 
	{
		// Save the position of the beginning of the message.
		*pFoundMsg = ptr;
		*pFoundMsgTmpLen = len;

		// Expected min message length.
		msglen = MIN_STANDARD_BUF_LEN_HOKUYO;

		// Search just after the message.
		if (FindHokuyoMessage(*pFoundMsg+msglen, *pFoundMsgTmpLen-msglen, &ptr, &len) != EXIT_SUCCESS)
		{
			break;
		}
	}

	return EXIT_SUCCESS;
}